

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

bool CastToBool(valtype *vch)

{
  long lVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  const_reference pvVar3;
  ulong __n;
  size_type sVar4;
  long in_FS_OFFSET;
  uint i;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  size_type in_stack_ffffffffffffffd0;
  undefined4 local_1c;
  undefined1 local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c = 0;
  do {
    this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ulong)local_1c;
    pvVar2 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    if (pvVar2 <= this) {
      local_9 = false;
LAB_003e610e:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_9;
      }
      __stack_chk_fail();
    }
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (this,in_stack_ffffffffffffffd0);
    if (*pvVar3 != '\0') {
      __n = (ulong)local_1c;
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
      if (__n == sVar4 - 1) {
        pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,__n);
        if (*pvVar3 == 0x80) {
          local_9 = false;
          goto LAB_003e610e;
        }
      }
      local_9 = true;
      goto LAB_003e610e;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool CastToBool(const valtype& vch)
{
    for (unsigned int i = 0; i < vch.size(); i++)
    {
        if (vch[i] != 0)
        {
            // Can be negative zero
            if (i == vch.size()-1 && vch[i] == 0x80)
                return false;
            return true;
        }
    }
    return false;
}